

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl-int-type.cpp
# Opt level: O1

Up __thiscall yactfr::FixedLengthSignedIntegerType::_clone(FixedLengthSignedIntegerType *this)

{
  int in_ECX;
  void *in_RDX;
  long in_RSI;
  void *in_R8;
  _Head_base<0UL,_const_yactfr::MapItem_*,_false> local_48;
  undefined1 local_40 [32];
  MapItem *local_20;
  
  local_40._28_4_ = *(ByteOrder *)(in_RSI + 0xc);
  local_40._24_4_ = *(uint *)(in_RSI + 0x18);
  local_40._20_4_ = *(undefined4 *)(in_RSI + 0x1c);
  local_40._16_4_ = *(undefined4 *)(in_RSI + 0x20);
  local_40._12_4_ = *(uint *)(in_RSI + 0x28);
  if (*(__fn **)(in_RSI + 0x10) == (__fn *)0x0) {
    local_48._M_head_impl = (MapItem *)0x0;
  }
  else {
    MapItem::clone((MapItem *)&stack0xffffffffffffffe0,*(__fn **)(in_RSI + 0x10),in_RDX,in_ECX,in_R8
                  );
    local_48._M_head_impl = local_20;
    local_20 = (MapItem *)0x0;
    std::unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>::~unique_ptr
              ((unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> *)
               &stack0xffffffffffffffe0);
  }
  create<unsigned_int,unsigned_int,yactfr::ByteOrder,yactfr::BitOrder,yactfr::DisplayBase,std::map<std::__cxx11::string,yactfr::IntegerRangeSet<long_long,true>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,yactfr::IntegerRangeSet<long_long,true>>>>const&,std::unique_ptr<yactfr::MapItem_const,std::default_delete<yactfr::MapItem_const>>>
            ((FixedLengthSignedIntegerType *)local_40,(uint *)(local_40 + 0x1c),
             (uint *)(local_40 + 0x18),(ByteOrder *)(local_40 + 0x14),(BitOrder *)(local_40 + 0x10),
             (DisplayBase *)(local_40 + 0xc),
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::IntegerRangeSet<long_long,_true>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::IntegerRangeSet<long_long,_true>_>_>_>
              *)(in_RSI + 0x30),
             (unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> *)
             &local_48);
  (this->super_FixedLengthIntegerType<long_long>).super_FixedLengthBitArrayType.super_ScalarDataType
  .super_DataType._vptr_DataType = (_func_int **)local_40._0_8_;
  local_40._0_8_ = (_func_int **)0x0;
  std::unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>::~unique_ptr
            ((unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> *)
             &local_48);
  return (__uniq_ptr_data<const_yactfr::DataType,_std::default_delete<const_yactfr::DataType>,_true,_true>
          )(__uniq_ptr_data<const_yactfr::DataType,_std::default_delete<const_yactfr::DataType>,_true,_true>
            )this;
}

Assistant:

DataType::Up FixedLengthSignedIntegerType::_clone() const
{
    return FixedLengthSignedIntegerType::create(this->alignment(), this->length(),
                                                this->byteOrder(), this->bitOrder(),
                                                this->preferredDisplayBase(), this->mappings(),
                                                internal::tryCloneAttrs(this->attributes()));
}